

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

double __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_number
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  size_t sVar1;
  char cVar2;
  bool bVar3;
  xpath_node *pxVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_b8;
  xpath_allocator_capture local_a0;
  undefined1 local_80 [16];
  xpath_node *local_70;
  xpath_allocator_capture local_60;
  xpath_string local_40;
  
LAB_0011cee0:
  switch(this->_type) {
  case '\t':
    dVar6 = eval_number(this->_left,c,stack);
    dVar5 = eval_number(this->_right,c,stack);
    return dVar5 + dVar6;
  case '\n':
    dVar6 = eval_number(this->_left,c,stack);
    dVar5 = eval_number(this->_right,c,stack);
    return dVar6 - dVar5;
  case '\v':
    dVar6 = eval_number(this->_left,c,stack);
    dVar5 = eval_number(this->_right,c,stack);
    return dVar5 * dVar6;
  case '\f':
    dVar6 = eval_number(this->_left,c,stack);
    dVar5 = eval_number(this->_right,c,stack);
    return dVar6 / dVar5;
  case '\r':
    dVar6 = eval_number(this->_left,c,stack);
    dVar5 = eval_number(this->_right,c,stack);
    dVar6 = fmod(dVar6,dVar5);
    return dVar6;
  case '\x0e':
    dVar6 = eval_number(this->_left,c,stack);
    return -dVar6;
  default:
    cVar2 = this->_rettype;
    break;
  case '\x13':
    return (this->_data).number;
  case '\x14':
    cVar2 = this->_rettype;
    if (cVar2 == '\x02') {
      if (((this->_data).variable)->_type == xpath_type_number) {
        return *(double *)((this->_data).variable + 1);
      }
      return NAN;
    }
    break;
  case '\x15':
    sVar1 = c->size;
    goto LAB_0011d23a;
  case '\x16':
    sVar1 = c->position;
LAB_0011d23a:
    auVar7._0_8_ = (double)CONCAT44(0x43300000,(int)sVar1);
    auVar7._8_4_ = (int)(sVar1 >> 0x20);
    auVar7._12_4_ = 0x45300000;
    return (auVar7._8_8_ - 1.9342813113834067e+25) + (auVar7._0_8_ - 4503599627370496.0);
  case '\x17':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_node_set((xpath_node_set_raw *)local_80,this->_left,c,stack,nodeset_eval_all);
    local_70 = (xpath_node *)((long)local_70 - CONCAT71(local_80._9_7_,local_80[8]) >> 4);
    goto LAB_0011d31a;
  case '(':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    string_value((xpath_string *)local_80,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,local_a0._target);
    goto LAB_0011d21f;
  case ')':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_string((xpath_string *)local_80,this->_left,c,stack);
LAB_0011d21f:
    if (local_80[8] != true) {
      local_70 = (xpath_node *)strlen((char *)local_80._0_8_);
    }
LAB_0011d31a:
    auVar8._8_4_ = (int)((ulong)local_70 >> 0x20);
    auVar8._0_8_ = local_70;
    auVar8._12_4_ = 0x45300000;
    local_b8 = (auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_70) - 4503599627370496.0);
    goto LAB_0011d3d4;
  case '2':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    string_value((xpath_string *)local_80,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,local_a0._target);
    dVar6 = convert_string_to_number((char_t *)local_80._0_8_);
    xpath_allocator_capture::~xpath_allocator_capture(&local_a0);
    return dVar6;
  case '3':
    goto switchD_0011cef7_caseD_33;
  case '4':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_node_set((xpath_node_set_raw *)local_80,this->_left,c,stack,nodeset_eval_all);
    pxVar4 = (xpath_node *)CONCAT71(local_80._9_7_,local_80[8]);
    if (pxVar4 == local_70) {
      local_b8 = 0.0;
    }
    else {
      local_b8 = 0.0;
      do {
        local_60._target = stack->result;
        local_60._state._error = (local_60._target)->_error;
        local_60._state._root = (local_60._target)->_root;
        local_60._state._root_size = (local_60._target)->_root_size;
        string_value(&local_40,(anon_unknown_0 *)(pxVar4->_node)._root,
                     (xpath_node *)(pxVar4->_attribute)._attr,local_60._target);
        dVar6 = convert_string_to_number(local_40._buffer);
        local_b8 = local_b8 + dVar6;
        xpath_allocator_capture::~xpath_allocator_capture(&local_60);
        pxVar4 = pxVar4 + 1;
      } while (pxVar4 != local_70);
    }
    goto LAB_0011d3d4;
  case '5':
    local_b8 = eval_number(this->_left,c,stack);
    dVar6 = floor(local_b8);
    goto LAB_0011d2b3;
  case '6':
    local_b8 = eval_number(this->_left,c,stack);
    dVar6 = ceil(local_b8);
LAB_0011d2b3:
    return (double)(~-(ulong)(!NAN(local_b8) && !NAN(local_b8)) & (ulong)local_b8 |
                   (ulong)dVar6 & -(ulong)(!NAN(local_b8) && !NAN(local_b8)));
  case '7':
    dVar6 = eval_number(this->_left,c,stack);
    if ((-0.5 <= dVar6) && (dVar6 <= 0.0)) {
      dVar6 = ceil(dVar6);
      return dVar6;
    }
    dVar6 = floor(dVar6 + 0.5);
    return dVar6;
  }
  if (cVar2 == '\x01') {
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_string((xpath_string *)local_80,this,c,stack);
  }
  else {
    if (cVar2 != '\x03') {
      if (cVar2 != '\x04') {
        return 0.0;
      }
      bVar3 = eval_boolean(this,c,stack);
      return (double)bVar3;
    }
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_string((xpath_string *)local_80,this,c,stack);
  }
  local_b8 = convert_string_to_number((char_t *)local_80._0_8_);
LAB_0011d3d4:
  xpath_allocator_capture::~xpath_allocator_capture(&local_a0);
  return local_b8;
switchD_0011cef7_caseD_33:
  this = this->_left;
  goto LAB_0011cee0;
}

Assistant:

double eval_number(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_add:
				return _left->eval_number(c, stack) + _right->eval_number(c, stack);

			case ast_op_subtract:
				return _left->eval_number(c, stack) - _right->eval_number(c, stack);

			case ast_op_multiply:
				return _left->eval_number(c, stack) * _right->eval_number(c, stack);

			case ast_op_divide:
				return _left->eval_number(c, stack) / _right->eval_number(c, stack);

			case ast_op_mod:
				return fmod(_left->eval_number(c, stack), _right->eval_number(c, stack));

			case ast_op_negate:
				return -_left->eval_number(c, stack);

			case ast_number_constant:
				return _data.number;

			case ast_func_last:
				return static_cast<double>(c.size);

			case ast_func_position:
				return static_cast<double>(c.position);

			case ast_func_count:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_node_set(c, stack, nodeset_eval_all).size());
			}

			case ast_func_string_length_0:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(string_value(c.n, stack.result).length());
			}

			case ast_func_string_length_1:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_string(c, stack).length());
			}

			case ast_func_number_0:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(string_value(c.n, stack.result).c_str());
			}

			case ast_func_number_1:
				return _left->eval_number(c, stack);

			case ast_func_sum:
			{
				xpath_allocator_capture cr(stack.result);

				double r = 0;

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* it = ns.begin(); it != ns.end(); ++it)
				{
					xpath_allocator_capture cri(stack.result);

					r += convert_string_to_number(string_value(*it, stack.result).c_str());
				}

				return r;
			}

			case ast_func_floor:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? floor(r) : r;
			}

			case ast_func_ceiling:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? ceil(r) : r;
			}

			case ast_func_round:
				return round_nearest_nzero(_left->eval_number(c, stack));

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_number)
					return _data.variable->get_number();
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return eval_boolean(c, stack) ? 1 : 0;

				case xpath_type_string:
				{
					xpath_allocator_capture cr(stack.result);

					return convert_string_to_number(eval_string(c, stack).c_str());
				}

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.result);

					return convert_string_to_number(eval_string(c, stack).c_str());
				}

				default:
					assert(false && "Wrong expression for return type number"); // unreachable
					return 0;
				}

			}
			}
		}